

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval-comp.cpp
# Opt level: O0

void __thiscall IntervalComp_plus_Test::TestBody(IntervalComp_plus_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr *ex;
  AssertHelper local_e0;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  ExprPtr local_90;
  ExprPtr local_80;
  ExprPtr local_70;
  undefined1 local_60 [8];
  ExprPtr range1;
  ExprPtr local_40;
  ExprPtr local_30;
  undefined1 local_20 [8];
  ExprPtr e;
  IntervalComp_plus_Test *this_local;
  
  e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  mathiu::impl::operator____s((impl *)&local_30,"x",1);
  mathiu::impl::operator____s((impl *)&local_40,"y",1);
  mathiu::impl::operator+((impl *)local_20,&local_30,&local_40);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_40);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_30);
  mathiu::impl::operator____s((impl *)&local_70,"x",1);
  mathiu::impl::operator____i((impl *)&local_90,1);
  mathiu::impl::operator____i((impl *)&gtest_ar.message_,2);
  mathiu::impl::interval((impl *)&local_80,&local_90,true,(ExprPtr *)&gtest_ar.message_,false);
  mathiu::impl::functionRange((impl *)local_60,(ExprPtr *)local_20,&local_70,&local_80);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_80);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_90);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_70);
  mathiu::impl::toString_abi_cxx11_(&local_d0,(impl *)local_60,ex);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[29],_nullptr>
            ((EqHelper *)local_b0,"toString(range1)","\"(COInterval (+ 1 y) (+ 2 y))\"",&local_d0,
             (char (*) [29])"(COInterval (+ 1 y) (+ 2 y))");
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/interval-comp.cpp"
               ,10,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_60);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(IntervalComp, plus)
{
    auto const e = "x"_s + "y"_s;
    auto const range1 = functionRange(e, "x"_s, interval(1_i, true, 2_i, false));
    EXPECT_EQ(toString(range1), "(COInterval (+ 1 y) (+ 2 y))");
}